

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Teleport
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *pAVar1;
  PClassActor *type;
  int iVar2;
  uint uVar3;
  int iVar4;
  MetaClass *pMVar5;
  VMValue *pVVar6;
  DSpotState *this;
  AActor *pAVar7;
  bool bVar8;
  double dVar9;
  double y;
  double local_1a0;
  double local_180;
  int local_160;
  bool local_142;
  bool local_13f;
  FName local_13c;
  DVector3 local_138;
  DVector3 local_120;
  AActor *local_108;
  AActor *fog2;
  AActor *fog1;
  undefined1 local_f0 [7];
  bool tele_result;
  DVector3 tpos;
  double finalz;
  double aboveFloor;
  DVector3 prev;
  double posz;
  AActor *spot;
  DSpotState *state;
  uint chanceindex;
  AActor *ref;
  VMValue *pVStack_80;
  int ptr;
  double maxdist;
  double mindist;
  PClassActor *pPStack_68;
  int flags;
  MetaClass *fog_type;
  MetaClass *target_type;
  FState *teleport_state;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1378,
                  "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar8 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar8 = true, (param->field_0).field_1.atag != 1)) {
    bVar8 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar8) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1378,
                  "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  stateowner = (AActor *)(param->field_0).field_1.a;
  local_13f = true;
  if (stateowner != (AActor *)0x0) {
    local_13f = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
  }
  if (local_13f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1378,
                  "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1378,
                  "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar8 = false;
  if (((char)defaultparam_local[(int)self].Count == '\x03') &&
     (bVar8 = true, defaultparam_local[(int)self].Most != 1)) {
    bVar8 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
  }
  if (bVar8) {
    stateinfo = (FStateParamInfo *)defaultparam_local[(int)self].Array;
    local_142 = true;
    if ((DObject *)stateinfo != (DObject *)0x0) {
      local_142 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
    }
    if (local_142 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1378,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar2 = (int)self + 1;
    if (ret_local._4_4_ <= iVar2) {
      self._0_4_ = iVar2;
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1378,
                    "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if ((char)defaultparam_local[iVar2].Count == '\x03') {
      teleport_state = (FState *)defaultparam_local[iVar2].Array;
      self._0_4_ = (int)self + 2;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1379,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar2 = *(int *)&defaultparam_local[(int)self].Array;
        pMVar5 = AActor::GetClass(stateowner);
        target_type = (MetaClass *)FStateLabelStorage::GetState(&StateLabels,iVar2,pMVar5,false);
      }
      else {
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        if ((pVVar6->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1379,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        iVar2 = (pVVar6->field_0).i;
        pMVar5 = AActor::GetClass(stateowner);
        target_type = (MetaClass *)FStateLabelStorage::GetState(&StateLabels,iVar2,pMVar5,false);
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        bVar8 = false;
        if (((char)defaultparam_local[(int)self].Count == '\x03') &&
           (bVar8 = true, defaultparam_local[(int)self].Most != 1)) {
          bVar8 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
        }
        if (!bVar8) {
          __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137a,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        fog_type = (MetaClass *)defaultparam_local[(int)self].Array;
      }
      else {
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        bVar8 = false;
        if ((pVVar6->field_0).field_3.Type == '\x03') {
          pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
          bVar8 = true;
          if ((pVVar6->field_0).field_1.atag != 1) {
            pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
            bVar8 = (pVVar6->field_0).field_1.a == (void *)0x0;
          }
        }
        if (!bVar8) {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137a,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        fog_type = (MetaClass *)(pVVar6->field_0).field_1.a;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        bVar8 = false;
        if (((char)defaultparam_local[(int)self].Count == '\x03') &&
           (bVar8 = true, defaultparam_local[(int)self].Most != 1)) {
          bVar8 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
        }
        if (!bVar8) {
          __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137b,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pPStack_68 = (PClassActor *)defaultparam_local[(int)self].Array;
      }
      else {
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        bVar8 = false;
        if ((pVVar6->field_0).field_3.Type == '\x03') {
          pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
          bVar8 = true;
          if ((pVVar6->field_0).field_1.atag != 1) {
            pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
            bVar8 = (pVVar6->field_0).field_1.a == (void *)0x0;
          }
        }
        if (!bVar8) {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137b,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        pPStack_68 = (PClassActor *)(pVVar6->field_0).field_1.a;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137c,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        mindist._4_4_ = *(uint *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        if ((pVVar6->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137c,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        mindist._4_4_ = (pVVar6->field_0).i;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137d,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        maxdist = (double)defaultparam_local[(int)self].Array;
      }
      else {
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        if ((pVVar6->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137d,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        maxdist = (pVVar6->field_0).f;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137e,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVStack_80 = defaultparam_local[(int)self].Array;
      }
      else {
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        if ((pVVar6->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137e,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        pVStack_80 = (VMValue *)(pVVar6->field_0).field_1.a;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137f,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        ref._4_4_ = *(int *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        if ((pVVar6->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x137f,
                        "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar6 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        ref._4_4_ = (pVVar6->field_0).i;
      }
      _chanceindex = COPY_AAPTR(stateowner,ref._4_4_);
      if (1 < self._4_4_) {
        VMReturn::SetInt(_paramnum + 1,0);
        self._4_4_ = 2;
      }
      if (0 < self._4_4_) {
        VMReturn::SetPointer(_paramnum,(void *)0x0,0);
      }
      if (_chanceindex == (AActor *)0x0) {
        param_local._4_4_ = self._4_4_;
      }
      else {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  ((TFlags<ActorFlag2,_unsigned_int> *)((long)&state + 4),
                   (int)_chanceindex + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&state + 4));
        if (uVar3 == 0 || (mindist._4_4_ & 0x400) != 0) {
          if ((mindist._4_4_ & 2) != 0) {
            iVar2 = _chanceindex->health;
            iVar4 = AActor::SpawnHealth(_chanceindex);
            if (iVar4 / 8 == 0) {
              local_160 = 1;
            }
            else {
              local_160 = AActor::SpawnHealth(_chanceindex);
              local_160 = local_160 / 8;
            }
            state._0_4_ = iVar2 / local_160;
            if (8 < (uint)state) {
              state._0_4_ = 8;
            }
            iVar2 = FRandom::operator()(&pr_teleport);
            if (AF_AActor_A_Teleport::chance[(uint)state] <= iVar2) {
              return self._4_4_;
            }
          }
          this = DSpotState::GetSpotState(true);
          if (this == (DSpotState *)0x0) {
            param_local._4_4_ = self._4_4_;
          }
          else {
            if (fog_type == (MetaClass *)0x0) {
              fog_type = PClass::FindActor("BossSpot");
            }
            pMVar5 = fog_type;
            dVar9 = AActor::X(_chanceindex);
            y = AActor::Y(_chanceindex);
            pAVar7 = &DSpotState::GetSpotWithMinMaxDistance
                                (this,pMVar5,dVar9,y,maxdist,(double)pVStack_80)->super_AActor;
            if (pAVar7 == (AActor *)0x0) {
              param_local._4_4_ = self._4_4_;
            }
            else {
              if ((mindist._4_4_ & 0x800) != 0) {
                if ((mindist._4_4_ & 0x20) == 0) {
                  local_180 = pAVar7->floorz;
                }
                else {
                  local_180 = AActor::Z(pAVar7);
                }
                prev.Z = local_180;
                dVar9 = local_180 + _chanceindex->Height;
                if ((pAVar7->ceilingz <= dVar9 && dVar9 != pAVar7->ceilingz) ||
                   (local_180 < pAVar7->floorz)) {
                  return self._4_4_;
                }
              }
              AActor::Pos((DVector3 *)&aboveFloor,_chanceindex);
              dVar9 = AActor::Z(pAVar7);
              tpos.Z = pAVar7->floorz + (dVar9 - pAVar7->floorz);
              dVar9 = AActor::Top(pAVar7);
              if (dVar9 < pAVar7->ceilingz || dVar9 == pAVar7->ceilingz) {
                dVar9 = AActor::Z(pAVar7);
                if (dVar9 < pAVar7->floorz) {
                  tpos.Z = pAVar7->floorz;
                }
              }
              else {
                tpos.Z = pAVar7->ceilingz - _chanceindex->Height;
              }
              AActor::PosAtZ((DVector3 *)local_f0,pAVar7,tpos.Z);
              fog1._7_1_ = P_TeleportMove(_chanceindex,(DVector3 *)local_f0,(mindist._4_4_ & 1) != 0
                                          ,true);
              if ((!(bool)fog1._7_1_) && ((mindist._4_4_ & 4) != 0)) {
                AActor::SetOrigin(_chanceindex,(DVector3 *)local_f0,false);
                fog1._7_1_ = true;
              }
              fog2 = (AActor *)0x0;
              local_108 = (AActor *)0x0;
              if ((bool)fog1._7_1_ != false) {
                if ((pPStack_68 != (PClassActor *)0x0) || ((mindist._4_4_ & 0x100) != 0)) {
                  if ((mindist._4_4_ & 0x40) == 0) {
                    if ((mindist._4_4_ & 0x100) == 0) {
                      fog2 = Spawn(pPStack_68,(DVector3 *)&aboveFloor,ALLOW_REPLACE);
                      if (fog2 != (AActor *)0x0) {
                        TObjPtr<AActor>::operator=(&fog2->target,_chanceindex);
                      }
                    }
                    else {
                      P_SpawnTeleportFog(_chanceindex,(DVector3 *)&aboveFloor,true,true);
                    }
                  }
                  type = pPStack_68;
                  pAVar1 = _chanceindex;
                  if ((mindist._4_4_ & 0x80) == 0) {
                    if ((mindist._4_4_ & 0x100) == 0) {
                      AActor::Pos(&local_138,_chanceindex);
                      local_108 = Spawn(type,&local_138,ALLOW_REPLACE);
                      if (local_108 != (AActor *)0x0) {
                        TObjPtr<AActor>::operator=(&local_108->target,_chanceindex);
                      }
                    }
                    else {
                      AActor::Pos(&local_120,_chanceindex);
                      P_SpawnTeleportFog(pAVar1,&local_120,false,true);
                    }
                  }
                }
                pAVar1 = _chanceindex;
                if ((mindist._4_4_ & 0x20) == 0) {
                  local_1a0 = _chanceindex->floorz;
                }
                else {
                  local_1a0 = AActor::Z(pAVar7);
                }
                AActor::SetZ(pAVar1,local_1a0,false);
                if ((mindist._4_4_ & 0x10) == 0) {
                  TAngle<double>::operator=(&(_chanceindex->Angles).Yaw,&(pAVar7->Angles).Yaw);
                }
                if ((mindist._4_4_ & 8) == 0) {
                  TVector3<double>::Zero(&_chanceindex->Vel);
                }
                pAVar7 = stateowner;
                if ((mindist._4_4_ & 0x200) == 0) {
                  if (target_type == (MetaClass *)0x0) {
                    FName::FName(&local_13c,"Teleport");
                    target_type = (MetaClass *)AActor::FindState(pAVar7,&local_13c);
                    if (target_type == (MetaClass *)0x0) {
                      return self._4_4_;
                    }
                  }
                  if (0 < self._4_4_) {
                    VMReturn::SetPointer(_paramnum,target_type,0);
                  }
                  return self._4_4_;
                }
              }
              if (1 < self._4_4_) {
                VMReturn::SetInt(_paramnum + 1,(uint)(fog1._7_1_ & 1));
              }
              param_local._4_4_ = self._4_4_;
            }
          }
        }
        else {
          param_local._4_4_ = self._4_4_;
        }
      }
      return param_local._4_4_;
    }
    self._0_4_ = iVar2;
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1378,
                  "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1378,
                "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Teleport)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_STATE_DEF		(teleport_state)			
	PARAM_CLASS_DEF		(target_type, ASpecialSpot)	
	PARAM_CLASS_DEF		(fog_type, AActor)			
	PARAM_INT_DEF		(flags)						
	PARAM_FLOAT_DEF		(mindist)					
	PARAM_FLOAT_DEF		(maxdist)					
	PARAM_INT_DEF		(ptr)						

	AActor *ref = COPY_AAPTR(self, ptr);

	// A_Teleport and A_Warp were the only codepointers that can state jump
	// *AND* have a meaningful inventory state chain result. Grrr.
	if (numret > 1)
	{
		ret[1].SetInt(false);
		numret = 2;
	}
	if (numret > 0)
	{
		ret[0].SetPointer(NULL, ATAG_STATE);
	}

	if (!ref)
	{
		return numret;
	}

	if ((ref->flags2 & MF2_NOTELEPORT) && !(flags & TF_OVERRIDE))
	{
		return numret;
	}

	// Randomly choose not to teleport like A_Srcr2Decide.
	if (flags & TF_RANDOMDECIDE)
	{
		static const int chance[] =
		{
			192, 120, 120, 120, 64, 64, 32, 16, 0
		};

		unsigned int chanceindex = ref->health / ((ref->SpawnHealth()/8 == 0) ? 1 : ref->SpawnHealth()/8);

		if (chanceindex >= countof(chance))
		{
			chanceindex = countof(chance) - 1;
		}

		if (pr_teleport() >= chance[chanceindex])
		{
			return numret;
		}
	}

	DSpotState *state = DSpotState::GetSpotState();
	if (state == NULL)
	{
		return numret;
	}

	if (target_type == NULL)
	{
		target_type = PClass::FindActor("BossSpot");
	}

	AActor *spot = state->GetSpotWithMinMaxDistance(target_type, ref->X(), ref->Y(), mindist, maxdist);
	if (spot == NULL)
	{
		return numret;
	}

	// [MC] By default, the function adjusts the actor's Z if it's below the floor or above the ceiling.
	// This can be an issue as actors designed to maintain specific z positions wind up teleporting
	// anyway when they should not, such as a floor rising above or ceiling lowering below the position
	// of the spot.
	if (flags & TF_SENSITIVEZ)
	{
		double posz = (flags & TF_USESPOTZ) ? spot->Z() : spot->floorz;
		if ((posz + ref->Height > spot->ceilingz) || (posz < spot->floorz))
		{
			return numret;
		}
	}
	DVector3 prev = ref->Pos();
	double aboveFloor = spot->Z() - spot->floorz;
	double finalz = spot->floorz + aboveFloor;

	if (spot->Top() > spot->ceilingz)
		finalz = spot->ceilingz - ref->Height;
	else if (spot->Z() < spot->floorz)
		finalz = spot->floorz;

	DVector3 tpos = spot->PosAtZ(finalz);

	//Take precedence and cooperate with telefragging first.
	bool tele_result = P_TeleportMove(ref, tpos, !!(flags & TF_TELEFRAG));

	if (!tele_result && (flags & TF_FORCED))
	{
		//If for some reason the original move didn't work, regardless of telefrag, force it to move.
		ref->SetOrigin(tpos, false);
		tele_result = true;
	}

	AActor *fog1 = NULL, *fog2 = NULL;
	if (tele_result)
	{
		//If a fog type is defined in the parameter, or the user wants to use the actor's predefined fogs,
		//and if there's no desire to be fogless, spawn a fog based upon settings.
		if (fog_type || (flags & TF_USEACTORFOG))
		{ 
			if (!(flags & TF_NOSRCFOG))
			{
				if (flags & TF_USEACTORFOG)
					P_SpawnTeleportFog(ref, prev, true, true);
				else
				{
					fog1 = Spawn(fog_type, prev, ALLOW_REPLACE);
					if (fog1 != NULL)
						fog1->target = ref;
				}
			}
			if (!(flags & TF_NODESTFOG))
			{
				if (flags & TF_USEACTORFOG)
					P_SpawnTeleportFog(ref, ref->Pos(), false, true);
				else
				{
					fog2 = Spawn(fog_type, ref->Pos(), ALLOW_REPLACE);
					if (fog2 != NULL)
						fog2->target = ref;
				}
			}
		}
		
		ref->SetZ((flags & TF_USESPOTZ) ? spot->Z() : ref->floorz, false);

		if (!(flags & TF_KEEPANGLE))
			ref->Angles.Yaw = spot->Angles.Yaw;

		if (!(flags & TF_KEEPVELOCITY)) ref->Vel.Zero();

		if (!(flags & TF_NOJUMP)) //The state jump should only happen with the calling actor.
		{
			if (teleport_state == NULL)
			{
				// Default to Teleport.
				teleport_state = self->FindState("Teleport");
				// If still nothing, then return.
				if (teleport_state == NULL)
				{
					return numret;
				}
			}
			if (numret > 0)
			{
				ret[0].SetPointer(teleport_state, ATAG_STATE);
			}
			return numret;
		}
	}
	if (numret > 1)
	{
		ret[1].SetInt(tele_result);
	}
	return numret;
}